

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O1

iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> __thiscall
slang::ast::Scope::membersOfType<slang::ast::VariableSymbol>(Scope *this)

{
  Symbol *pSVar1;
  uint uVar2;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> iVar3;
  
  if (this->deferredMemberIndex != Invalid) {
    elaborate(this);
  }
  pSVar1 = this->firstMember;
  while ((pSVar1 != (Symbol *)0x0 &&
         ((uVar2 = pSVar1->kind - Variable, 0x18 < uVar2 ||
          ((0x1800c0fU >> (uVar2 & 0x1f) & 1) == 0))))) {
    pSVar1 = pSVar1->nextInScope;
  }
  iVar3.m_end.current = (Symbol *)0x0;
  iVar3.m_begin.current = pSVar1;
  return iVar3;
}

Assistant:

iterator_range<specific_symbol_iterator<T>> membersOfType() const {
        ensureElaborated();
        return {firstMember, nullptr};
    }